

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeDistinct(Parse *pParse,int eTnctType,int iTab,int addrRepeat,ExprList *pEList,int regElem)

{
  int p4;
  Vdbe *p;
  int iVar1;
  CollSeq *zP4;
  int r1;
  CollSeq *pColl;
  int regPrev;
  int iJump;
  int i;
  Vdbe *v;
  int local_30;
  int nResultCol;
  int iRet;
  int regElem_local;
  ExprList *pEList_local;
  int addrRepeat_local;
  int iTab_local;
  int eTnctType_local;
  Parse *pParse_local;
  
  local_30 = 0;
  p4 = pEList->nExpr;
  p = pParse->pVdbe;
  if (eTnctType != 1) {
    if (eTnctType == 2) {
      local_30 = pParse->nMem + 1;
      pParse->nMem = p4 + pParse->nMem;
      iVar1 = sqlite3VdbeCurrentAddr(p);
      for (regPrev = 0; regPrev < p4; regPrev = regPrev + 1) {
        zP4 = sqlite3ExprCollSeq(pParse,pEList->a[regPrev].pExpr);
        if (regPrev < p4 + -1) {
          sqlite3VdbeAddOp3(p,0x34,regElem + regPrev,iVar1 + p4,local_30 + regPrev);
        }
        else {
          sqlite3VdbeAddOp3(p,0x35,regElem + regPrev,addrRepeat,local_30 + regPrev);
        }
        sqlite3VdbeChangeP4(p,-1,(char *)zP4,-2);
        sqlite3VdbeChangeP5(p,0x80);
      }
      sqlite3VdbeAddOp3(p,0x50,regElem,local_30,p4 + -1);
    }
    else {
      iVar1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4Int(p,0x1c,iTab,addrRepeat,regElem,p4);
      sqlite3VdbeAddOp3(p,0x61,regElem,p4,iVar1);
      sqlite3VdbeAddOp4Int(p,0x8a,iTab,iVar1,regElem,p4);
      sqlite3VdbeChangeP5(p,0x10);
      sqlite3ReleaseTempReg(pParse,iVar1);
      local_30 = iTab;
    }
  }
  return local_30;
}

Assistant:

static int codeDistinct(
  Parse *pParse,     /* Parsing and code generating context */
  int eTnctType,     /* WHERE_DISTINCT_* value */
  int iTab,          /* A sorting index used to test for distinctness */
  int addrRepeat,    /* Jump to here if not distinct */
  ExprList *pEList,  /* Expression for each element */
  int regElem        /* First element */
){
  int iRet = 0;
  int nResultCol = pEList->nExpr;
  Vdbe *v = pParse->pVdbe;

  switch( eTnctType ){
    case WHERE_DISTINCT_ORDERED: {
      int i;
      int iJump;              /* Jump destination */
      int regPrev;            /* Previous row content */

      /* Allocate space for the previous row */
      iRet = regPrev = pParse->nMem+1;
      pParse->nMem += nResultCol;

      iJump = sqlite3VdbeCurrentAddr(v) + nResultCol;
      for(i=0; i<nResultCol; i++){
        CollSeq *pColl = sqlite3ExprCollSeq(pParse, pEList->a[i].pExpr);
        if( i<nResultCol-1 ){
          sqlite3VdbeAddOp3(v, OP_Ne, regElem+i, iJump, regPrev+i);
          VdbeCoverage(v);
        }else{
          sqlite3VdbeAddOp3(v, OP_Eq, regElem+i, addrRepeat, regPrev+i);
          VdbeCoverage(v);
         }
        sqlite3VdbeChangeP4(v, -1, (const char *)pColl, P4_COLLSEQ);
        sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
      }
      assert( sqlite3VdbeCurrentAddr(v)==iJump || pParse->db->mallocFailed );
      sqlite3VdbeAddOp3(v, OP_Copy, regElem, regPrev, nResultCol-1);
      break;
    }

    case WHERE_DISTINCT_UNIQUE: {
      /* nothing to do */
      break;
    }

    default: {
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4Int(v, OP_Found, iTab, addrRepeat, regElem, nResultCol);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regElem, nResultCol, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iTab, r1, regElem, nResultCol);
      sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
      sqlite3ReleaseTempReg(pParse, r1);
      iRet = iTab;
      break;
    }
  }

  return iRet;
}